

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecutionQueue.cpp
# Opt level: O1

ProcessStatus __thiscall
llbuild::basic::ExecutionQueue::executeProcess
          (ExecutionQueue *this,QueueJobContext *context,ArrayRef<llvm::StringRef> commandLine)

{
  ProcessStatus PVar1;
  future<llbuild::basic::ProcessStatus> result;
  promise<llbuild::basic::ProcessStatus> p;
  promise<llbuild::basic::ProcessStatus> *local_b8;
  undefined8 uStack_b0;
  code *local_a8;
  undefined8 uStack_a0;
  undefined4 local_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined4 uStack_80;
  __basic_future<llbuild::basic::ProcessStatus> local_78;
  promise<llbuild::basic::ProcessStatus> *local_68;
  undefined8 local_60;
  code *local_58;
  code *local_50;
  char local_48;
  promise<llbuild::basic::ProcessStatus> local_40;
  
  std::promise<llbuild::basic::ProcessStatus>::promise(&local_40);
  std::__basic_future<llbuild::basic::ProcessStatus>::__basic_future(&local_78,&local_40._M_future);
  local_98 = CONCAT22(local_98._2_2_,1);
  uStack_90 = 0;
  uStack_88 = 0;
  uStack_80 = CONCAT22(uStack_80._2_2_,0x101);
  uStack_b0 = 0;
  local_a8 = (code *)0x0;
  uStack_a0 = 0;
  local_48 = '\x01';
  local_50 = std::
             _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/ExecutionQueue.cpp:45:19)>
             ::_M_invoke;
  local_60 = 0;
  local_58 = std::
             _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/ExecutionQueue.cpp:45:19)>
             ::_M_manager;
  local_b8 = &local_40;
  local_68 = &local_40;
  (*this->_vptr_ExecutionQueue[4])
            (this,context,commandLine.Data,commandLine.Length,0,0,local_98,0,0,uStack_80,&local_68,0
            );
  if (local_48 == '\x01') {
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,3);
    }
    local_48 = '\0';
  }
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,3);
  }
  PVar1 = std::future<llbuild::basic::ProcessStatus>::get
                    ((future<llbuild::basic::ProcessStatus> *)&local_78);
  if (local_78._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::promise<llbuild::basic::ProcessStatus>::~promise(&local_40);
  return PVar1;
}

Assistant:

ProcessStatus ExecutionQueue::executeProcess(QueueJobContext* context,
                                             ArrayRef<StringRef> commandLine) {
  std::promise<ProcessStatus> p;
  auto result = p.get_future();
  executeProcess(context, commandLine, {}, {true},
                 {[&p](ProcessResult result) mutable {
    p.set_value(result.status);
  }});
  return result.get();
}